

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O0

void __thiscall BarrierTest_Arrive_Test::TestBody(BarrierTest_Arrive_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  AssertHelper local_1f8;
  Message local_1f0 [6];
  exception *e_2;
  undefined1 auStack_1b8 [8];
  TrueWithString gtest_msg_2;
  AssertHelper local_178;
  Message local_170 [6];
  exception *e_1;
  undefined1 auStack_138 [8];
  TrueWithString gtest_msg_1;
  AssertHelper local_f8;
  Message local_f0 [6];
  exception *e;
  uint local_b8;
  undefined1 auStack_a8 [8];
  TrueWithString gtest_msg;
  undefined1 local_80 [8];
  barrier<yamc::detail::default_barrier_completion> barrier;
  BarrierTest_Arrive_Test *this_local;
  
  barrier.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)this;
  yamc::barrier<yamc::detail::default_barrier_completion>::barrier
            ((barrier<yamc::detail::default_barrier_completion> *)local_80,3);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_a8 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_a8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_a8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_b8 = (uint)yamc::barrier<yamc::detail::default_barrier_completion>::arrive
                                 ((barrier<yamc::detail::default_barrier_completion> *)local_80,1);
    }
  }
  else {
    testing::Message::Message(local_f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_1.value.field_2 + 8),
                   "Expected: (void)barrier.arrive() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_a8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)(gtest_msg_1.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_f0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_a8);
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  auStack_138 = (undefined1  [8])0x0;
  gtest_msg_1.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_1.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_138);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_138);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      e_1._4_4_ = yamc::barrier<yamc::detail::default_barrier_completion>::arrive
                            ((barrier<yamc::detail::default_barrier_completion> *)local_80,2);
    }
  }
  else {
    testing::Message::Message(local_170);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_2.value.field_2 + 8),
                   "Expected: (void)barrier.arrive(2) doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_138)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)(gtest_msg_2.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_170);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_138);
  gtest_msg_2.value._M_string_length = 0;
  gtest_msg_2.value.field_2._M_allocated_capacity = 0;
  auStack_1b8 = (undefined1  [8])0x0;
  gtest_msg_2.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_2.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_1b8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_1b8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      e_2._4_4_ = yamc::barrier<yamc::detail::default_barrier_completion>::arrive
                            ((barrier<yamc::detail::default_barrier_completion> *)local_80,3);
    }
  }
  else {
    testing::Message::Message(local_1f0);
    std::operator+(&local_218,
                   "Expected: (void)barrier.arrive(3) doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1b8)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    testing::Message::~Message(local_1f0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_1b8);
  yamc::barrier<yamc::detail::default_barrier_completion>::~barrier
            ((barrier<yamc::detail::default_barrier_completion> *)local_80);
  return;
}

Assistant:

TEST(BarrierTest, Arrive)
{
  yamc::barrier<> barrier{3};  // expected count=3
  EXPECT_NO_THROW((void)barrier.arrive());   // c=3->2
  EXPECT_NO_THROW((void)barrier.arrive(2));  // c=2->0, next phase
  EXPECT_NO_THROW((void)barrier.arrive(3));  // c=3->0, next phase
  // casting void to suppress "ignoring return value" warning
}